

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

TryTable * __thiscall
wasm::Builder::makeTryTable
          (Builder *this,Expression *body,vector<wasm::Name,_std::allocator<wasm::Name>_> *catchTags
          ,vector<wasm::Name,_std::allocator<wasm::Name>_> *catchDests,
          vector<bool,_std::allocator<bool>_> *catchRefs,optional<wasm::Type> type)

{
  TryTable *pTVar1;
  
  pTVar1 = MixedArena::alloc<wasm::TryTable>((MixedArena *)(this->wasm + 0x200));
  pTVar1->body = body;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&pTVar1->catchTags,catchTags);
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&pTVar1->catchDests,catchDests);
  ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
            ((ArenaVectorBase<ArenaVector<bool>,bool> *)&pTVar1->catchRefs,catchRefs);
  wasm::TryTable::finalize
            (pTVar1,type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_payload,
             type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._8_4_,this->wasm);
  return pTVar1;
}

Assistant:

TryTable* makeTryTable(Expression* body,
                         const std::vector<Name>& catchTags,
                         const std::vector<Name>& catchDests,
                         const std::vector<bool>& catchRefs,
                         std::optional<Type> type = std::nullopt) {
    auto* ret = wasm.allocator.alloc<TryTable>();
    ret->body = body;
    ret->catchTags.set(catchTags);
    ret->catchDests.set(catchDests);
    ret->catchRefs.set(catchRefs);
    ret->finalize(type, &wasm);
    return ret;
  }